

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter_p.h
# Opt level: O0

void __thiscall QCompletionEngine::~QCompletionEngine(QCompletionEngine *this)

{
  code *pcVar1;
  QCompletionEngine *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~QCompletionEngine() { }